

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3PagerWrite(PgHdr *pPg)

{
  Pager *pPVar1;
  PagerSavepoint *pPVar2;
  sqlite3_file *psVar3;
  void *pvVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  DbPage *pPg_00;
  uint uVar9;
  Pgno pgno;
  sqlite3_vfs *psVar10;
  uint uVar11;
  u32 i;
  long lVar12;
  int iVar13;
  DbPage *pDStack_40;
  undefined8 uStack_38;
  
  pPVar1 = pPg->pPager;
  if (((pPg->flags & 4) != 0) &&
     (uStack_38 = (PgHdr *)(ulong)pPVar1->dbSize, pPg->pgno <= pPVar1->dbSize)) {
    if (pPVar1->nSavepoint == 0) {
      return 0;
    }
    pPVar1 = pPg->pPager;
    iVar6 = pPVar1->nSavepoint;
    if (0 < (long)iVar6) {
      uVar9 = pPg->pgno;
      pPVar2 = pPVar1->aSavepoint;
      lVar12 = 0;
      do {
        if (uVar9 <= *(uint *)((long)pPVar2->aWalData + lVar12 + -8)) {
          pDStack_40 = (DbPage *)0x11dea6;
          iVar7 = sqlite3BitvecTestNotNull
                            (*(Bitvec **)((long)pPVar2->aWalData + lVar12 + -0x10),uVar9);
          iVar13 = sqlite3Config.nStmtSpill;
          if (iVar7 == 0) {
            if (pPVar1->journalMode == '\x02') goto LAB_0011decb;
            psVar3 = pPVar1->sjfd;
            if (psVar3->pMethods == (sqlite3_io_methods *)0x0) {
              if ((pPVar1->journalMode == '\x04') || (pPVar1->subjInMemory != '\0')) {
                psVar10 = pPVar1->pVfs;
                psVar3[6].pMethods = (sqlite3_io_methods *)0x0;
                psVar3[7].pMethods = (sqlite3_io_methods *)0x0;
                psVar3[4].pMethods = (sqlite3_io_methods *)0x0;
                psVar3[5].pMethods = (sqlite3_io_methods *)0x0;
                psVar3[2].pMethods = (sqlite3_io_methods *)0x0;
                psVar3[3].pMethods = (sqlite3_io_methods *)0x0;
                psVar3[8].pMethods = (sqlite3_io_methods *)0x0;
                iVar13 = -1;
                iVar6 = 0x3f8;
              }
              else {
                psVar10 = pPVar1->pVfs;
                psVar3[8].pMethods = (sqlite3_io_methods *)0x0;
                psVar3[9].pMethods = (sqlite3_io_methods *)0x0;
                psVar3[6].pMethods = (sqlite3_io_methods *)0x0;
                psVar3[7].pMethods = (sqlite3_io_methods *)0x0;
                psVar3[4].pMethods = (sqlite3_io_methods *)0x0;
                psVar3[5].pMethods = (sqlite3_io_methods *)0x0;
                psVar3[2].pMethods = (sqlite3_io_methods *)0x0;
                psVar3[3].pMethods = (sqlite3_io_methods *)0x0;
                psVar3->pMethods = (sqlite3_io_methods *)0x0;
                psVar3[1].pMethods = (sqlite3_io_methods *)0x0;
                psVar3[10].pMethods = (sqlite3_io_methods *)0x0;
                if (iVar13 == 0) {
                  pDStack_40 = (DbPage *)0x11dfe6;
                  iVar6 = (*psVar10->xOpen)((sqlite3_file *)psVar10,0);
                  if (iVar6 != 0) {
                    return iVar6;
                  }
                  goto LAB_0011df39;
                }
                iVar6 = 0x3f8;
                if (0 < iVar13) {
                  iVar6 = iVar13;
                }
              }
              *(int *)&psVar3[1].pMethods = iVar6;
              psVar3->pMethods = &MemJournalMethods;
              *(int *)((long)&psVar3[1].pMethods + 4) = iVar13;
              *(undefined4 *)&psVar3[8].pMethods = 0x201e;
              psVar3[10].pMethods = (sqlite3_io_methods *)0x0;
              psVar3[9].pMethods = (sqlite3_io_methods *)psVar10;
            }
LAB_0011df39:
            pvVar4 = pPg->pData;
            lVar12 = ((long)pPVar1->pageSize + 4) * (ulong)pPVar1->nSubRec;
            uVar9 = pPg->pgno;
            uStack_38 = (PgHdr *)CONCAT44(uVar9 >> 0x18 | (uVar9 & 0xff0000) >> 8 |
                                          (uVar9 & 0xff00) << 8 | uVar9 << 0x18,
                                          (undefined4)uStack_38);
            pDStack_40 = (DbPage *)0x11df6e;
            iVar6 = (*pPVar1->sjfd->pMethods->xWrite)
                              (pPVar1->sjfd,(void *)((long)&uStack_38 + 4),4,lVar12);
            if (iVar6 != 0) {
              return iVar6;
            }
            pDStack_40 = (DbPage *)0x11df90;
            iVar6 = (*pPVar1->sjfd->pMethods->xWrite)
                              (pPVar1->sjfd,pvVar4,pPVar1->pageSize,lVar12 + 4);
            if (iVar6 != 0) {
              return iVar6;
            }
            uVar9 = pPg->pgno;
LAB_0011decb:
            pPVar1->nSubRec = pPVar1->nSubRec + 1;
            pDStack_40 = (DbPage *)0x11ded8;
            iVar6 = addToSavepointBitvecs(pPVar1,uVar9);
            return iVar6;
          }
        }
        lVar12 = lVar12 + 0x30;
      } while ((long)iVar6 * 0x30 != lVar12);
    }
    return 0;
  }
  if (pPVar1->errCode != 0) {
    return pPVar1->errCode;
  }
  if (pPVar1->sectorSize <= (uint)pPVar1->pageSize) {
    iVar6 = pager_write(pPg);
    return iVar6;
  }
  pPVar1 = pPg->pPager;
  uVar9 = pPVar1->dbSize;
  uVar8 = pPVar1->sectorSize / (uint)pPVar1->pageSize;
  pPVar1->doNotSpill = pPVar1->doNotSpill | 4;
  uVar11 = pPg->pgno;
  pgno = -uVar8 & uVar11 - 1;
  if (uVar9 < uVar11) {
    uVar11 = uVar11 - pgno;
  }
  else {
    uVar11 = uVar9 - pgno;
    if (pgno + uVar8 <= uVar9) {
      uVar11 = uVar8;
    }
  }
  if ((int)uVar11 < 1) {
    iVar6 = 0;
  }
  else {
    bVar5 = false;
    iVar13 = 1;
    uStack_38 = pPg;
    do {
      i = pgno + iVar13;
      if (((i == uStack_38->pgno) || (pPVar1->pInJournal == (Bitvec *)0x0)) ||
         (iVar6 = sqlite3BitvecTestNotNull(pPVar1->pInJournal,i), iVar6 == 0)) {
        iVar6 = 0;
        if (i != sqlite3PendingByte / pPVar1->pageSize + 1U) {
          iVar6 = (*pPVar1->xGet)(pPVar1,i,&pDStack_40,0);
          if (iVar6 == 0) {
            iVar6 = pager_write(pDStack_40);
            if ((pDStack_40->flags & 8) != 0) {
              bVar5 = true;
            }
            goto LAB_00125564;
          }
          goto LAB_001255bc;
        }
      }
      else {
        pDStack_40 = sqlite3PagerLookup(pPVar1,i);
        iVar6 = 0;
        if (pDStack_40 != (DbPage *)0x0) {
          if ((pDStack_40->flags & 8) != 0) {
            bVar5 = true;
          }
LAB_00125564:
          sqlite3PagerUnrefNotNull(pDStack_40);
        }
      }
    } while ((iVar13 < (int)uVar11) && (iVar13 = iVar13 + 1, iVar6 == 0));
    if ((iVar6 == 0) && ((bVar5 && (0 < (int)uVar11)))) {
      do {
        pgno = pgno + 1;
        pPg_00 = sqlite3PagerLookup(pPVar1,pgno);
        if (pPg_00 != (DbPage *)0x0) {
          *(byte *)&pPg_00->flags = (byte)pPg_00->flags | 8;
          sqlite3PagerUnrefNotNull(pPg_00);
        }
        uVar11 = uVar11 - 1;
      } while (uVar11 != 0);
    }
  }
LAB_001255bc:
  pPVar1->doNotSpill = pPVar1->doNotSpill & 0xfb;
  return iVar6;
}

Assistant:

SQLITE_PRIVATE int sqlite3PagerWrite(PgHdr *pPg){
  Pager *pPager = pPg->pPager;
  assert( (pPg->flags & PGHDR_MMAP)==0 );
  assert( pPager->eState>=PAGER_WRITER_LOCKED );
  assert( assert_pager_state(pPager) );
  if( (pPg->flags & PGHDR_WRITEABLE)!=0 && pPager->dbSize>=pPg->pgno ){
    if( pPager->nSavepoint ) return subjournalPageIfRequired(pPg);
    return SQLITE_OK;
  }else if( pPager->errCode ){
    return pPager->errCode;
  }else if( pPager->sectorSize > (u32)pPager->pageSize ){
    assert( pPager->tempFile==0 );
    return pagerWriteLargeSector(pPg);
  }else{
    return pager_write(pPg);
  }
}